

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cpp
# Opt level: O3

int ScanIndexDirectory(TCHAR *szIndexPath,INDEX_FILE_FOUND pfnOnFileFound,PDWORD MainIndexes,
                      PDWORD OldIndexArray,void *pvContext)

{
  DIR *__dirp;
  dirent *pdVar1;
  
  __dirp = opendir(szIndexPath);
  if (__dirp != (DIR *)0x0) {
    while (pdVar1 = readdir(__dirp), pdVar1 != (dirent *)0x0) {
      if (pdVar1->d_type != '\x04') {
        (*pfnOnFileFound)(pdVar1->d_name,MainIndexes,OldIndexArray,pvContext);
      }
    }
    closedir(__dirp);
  }
  return 0;
}

Assistant:

int ScanIndexDirectory(
    const TCHAR * szIndexPath,
    INDEX_FILE_FOUND pfnOnFileFound,
    PDWORD MainIndexes,
    PDWORD OldIndexArray,
    void * pvContext)
{
#ifdef PLATFORM_WINDOWS

    WIN32_FIND_DATA wf;
    TCHAR * szSearchMask;
    HANDLE hFind;

    // Prepare the search mask
    szSearchMask = CombinePath(szIndexPath, _T("*"));
    if(szSearchMask == NULL)
        return ERROR_NOT_ENOUGH_MEMORY;

    // Prepare directory search
    hFind = FindFirstFile(szSearchMask, &wf);
    if(hFind != INVALID_HANDLE_VALUE)
    {
        // Skip the first file as it's always just "." or ".."
        while(FindNextFile(hFind, &wf))
        {
            // If the found object is a file, pass it to the handler
            if(!(wf.dwFileAttributes & FILE_ATTRIBUTE_DIRECTORY))
            {
                // Let the callback scan the file name
                pfnOnFileFound(wf.cFileName, MainIndexes, OldIndexArray, pvContext);
            }
        }

        // Close the search handle
        FindClose(hFind);
    }

    CASC_FREE(szSearchMask);

#else // PLATFORM_WINDOWS

    struct dirent * dir_entry;
    DIR * dir;

    dir = opendir(szIndexPath);
    if(dir != NULL)
    {
        while((dir_entry = readdir(dir)) != NULL)
        {
            if(dir_entry->d_type != DT_DIR)
            {
                pfnOnFileFound(dir_entry->d_name, MainIndexes, OldIndexArray, pvContext);
            }
        }

        closedir(dir);
    }

#endif

    return ERROR_SUCCESS;
}